

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O3

bool __thiscall CEditor::PopupNewFolder(CEditor *this,void *pContext,CUIRect View)

{
  CUI *this_00;
  bool bVar1;
  int iVar2;
  char *pText;
  int *pID;
  CUIRect *pRight;
  long in_FS_OFFSET;
  CUIRect ButtonBar;
  CUIRect Label;
  char aBuf [512];
  CUIRect local_258;
  CUIRect local_248;
  CUIRect local_238;
  char local_228 [512];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_238 = View;
  CUIRect::HSplitTop(&local_238,10.0,(CUIRect *)0x0,&local_238);
  CUIRect::HSplitTop(&local_238,30.0,&local_248,&local_238);
  this_00 = &this->m_UI;
  CUI::DoLabel(this_00,&local_248,"Create new folder",20.0,1,-1.0,true);
  CUIRect::HSplitBottom(&local_238,10.0,&local_238,(CUIRect *)0x0);
  CUIRect::HSplitBottom(&local_238,20.0,&local_238,&local_258);
  if (this->m_aFileDialogErrString[0] == '\0') {
    CUIRect::HSplitBottom(&local_238,40.0,&local_238,(CUIRect *)0x0);
    CUIRect::VMargin(&local_238,40.0,&local_238);
    CUIRect::HSplitBottom(&local_238,20.0,&local_238,&local_248);
    if (PopupNewFolder(void*,CUIRect)::s_FolderInput == '\0') {
      iVar2 = __cxa_guard_acquire(&PopupNewFolder(void*,CUIRect)::s_FolderInput);
      if (iVar2 != 0) {
        CLineInput::CLineInput(&PopupNewFolder::s_FolderInput,this->m_aFileDialogNewFolderName,0x40)
        ;
        __cxa_atexit(CLineInput::~CLineInput,&PopupNewFolder::s_FolderInput,&__dso_handle);
        __cxa_guard_release(&PopupNewFolder(void*,CUIRect)::s_FolderInput);
      }
    }
    CUI::DoEditBox(this_00,&PopupNewFolder::s_FolderInput,&local_248,15.0,0xf,
                   &LightButtonColorFunction.super_IButtonColorFunction);
    CUIRect::HSplitBottom(&local_238,20.0,&local_238,&local_248);
    CUI::DoLabel(this_00,&local_248,"Name:",10.0,0,-1.0,true);
    CUIRect::VSplitLeft(&local_258,30.0,(CUIRect *)0x0,&local_258);
    CUIRect::VSplitLeft(&local_258,110.0,&local_248,&local_258);
    iVar2 = DoButton_Editor(this,&PopupNewFolder::s_CreateButton,"Create",0,&local_248,0,(char *)0x0
                           );
    if ((iVar2 != 0) && (this->m_aFileDialogNewFolderName[0] != '\0')) {
      str_format(local_228,0x200,"%s/%s",this->m_pFileDialogPath,this->m_aFileDialogNewFolderName);
      iVar2 = (*(this->m_pStorage->super_IInterface)._vptr_IInterface[0xb])
                        (this->m_pStorage,local_228,0);
      if ((char)iVar2 != '\0') {
        FilelistPopulate(this,0);
        bVar1 = true;
        goto LAB_001a9c92;
      }
      str_copy(this->m_aFileDialogErrString,"Unable to create the folder",0x40);
    }
    CUIRect::VSplitRight(&local_258,30.0,&local_258,(CUIRect *)0x0);
    pRight = &local_248;
    CUIRect::VSplitRight(&local_258,110.0,&local_258,pRight);
    pID = &PopupNewFolder::s_AbortButton;
    pText = "Abort";
  }
  else {
    CUIRect::HSplitTop(&local_238,30.0,(CUIRect *)0x0,&local_238);
    CUIRect::VMargin(&local_238,40.0,&local_238);
    CUIRect::HSplitTop(&local_238,20.0,&local_248,&local_238);
    CUI::DoLabel(this_00,&local_248,"Error:",10.0,0,-1.0,true);
    CUIRect::HSplitTop(&local_238,20.0,&local_248,&local_238);
    CUI::DoLabel(this_00,&local_248,"Unable to create the folder",10.0,0,local_238.w,true);
    pRight = &local_258;
    CUIRect::VMargin(pRight,local_258.w * 0.5 + -55.0,pRight);
    pID = &PopupNewFolder(void*,CUIRect)::s_CreateButton;
    pText = "Ok";
  }
  iVar2 = DoButton_Editor(this,pID,pText,0,pRight,0,(char *)0x0);
  bVar1 = true;
  if (iVar2 == 0) {
    bVar1 = false;
  }
LAB_001a9c92:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CEditor::PopupNewFolder(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	CUIRect Label, ButtonBar;

	// title
	View.HSplitTop(10.0f, 0, &View);
	View.HSplitTop(30.0f, &Label, &View);
	pEditor->UI()->DoLabel(&Label, "Create new folder", 20.0f, TEXTALIGN_CENTER);

	View.HSplitBottom(10.0f, &View, 0);
	View.HSplitBottom(20.0f, &View, &ButtonBar);

	if(pEditor->m_aFileDialogErrString[0] == 0)
	{
		// interaction box
		View.HSplitBottom(40.0f, &View, 0);
		View.VMargin(40.0f, &View);
		View.HSplitBottom(20.0f, &View, &Label);
		static CLineInput s_FolderInput(pEditor->m_aFileDialogNewFolderName, sizeof(pEditor->m_aFileDialogNewFolderName));
		pEditor->DoEditBox(&s_FolderInput, &Label, 15.0f);
		View.HSplitBottom(20.0f, &View, &Label);
		pEditor->UI()->DoLabel(&Label, "Name:", 10.0f, TEXTALIGN_LEFT);

		// button bar
		ButtonBar.VSplitLeft(30.0f, 0, &ButtonBar);
		ButtonBar.VSplitLeft(110.0f, &Label, &ButtonBar);
		static int s_CreateButton = 0;
		if(pEditor->DoButton_Editor(&s_CreateButton, "Create", 0, &Label, 0, 0))
		{
			// create the folder
			if(pEditor->m_aFileDialogNewFolderName[0])
			{
				char aBuf[IO_MAX_PATH_LENGTH];
				str_format(aBuf, sizeof(aBuf), "%s/%s", pEditor->m_pFileDialogPath, pEditor->m_aFileDialogNewFolderName);
				if(pEditor->Storage()->CreateFolder(aBuf, IStorage::TYPE_SAVE))
				{
					pEditor->FilelistPopulate(IStorage::TYPE_SAVE);
					return true;
				}
				else
					str_copy(pEditor->m_aFileDialogErrString, "Unable to create the folder", sizeof(pEditor->m_aFileDialogErrString));
			}
		}
		ButtonBar.VSplitRight(30.0f, &ButtonBar, 0);
		ButtonBar.VSplitRight(110.0f, &ButtonBar, &Label);
		static int s_AbortButton = 0;
		if(pEditor->DoButton_Editor(&s_AbortButton, "Abort", 0, &Label, 0, 0))
			return true;
	}
	else
	{
		// error text
		View.HSplitTop(30.0f, 0, &View);
		View.VMargin(40.0f, &View);
		View.HSplitTop(20.0f, &Label, &View);
		pEditor->UI()->DoLabel(&Label, "Error:", 10.0f, TEXTALIGN_LEFT);
		View.HSplitTop(20.0f, &Label, &View);
		pEditor->UI()->DoLabel(&Label, "Unable to create the folder", 10.0f, TEXTALIGN_LEFT, View.w);

		// button
		ButtonBar.VMargin(ButtonBar.w/2.0f-55.0f, &ButtonBar);
		static int s_CreateButton = 0;
		if(pEditor->DoButton_Editor(&s_CreateButton, "Ok", 0, &ButtonBar, 0, 0))
			return true;
	}

	return false;
}